

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O0

atom_server init_atom_server(atom_cache_type cache_style)

{
  uint16_t uVar1;
  int iVar2;
  atom_server as_00;
  char *pcVar3;
  hostent *phVar4;
  atom_server as;
  
  as_00 = (atom_server)malloc(0xd8);
  nt_socket_init_func();
  if (atom_server_host == (char *)0x0) {
    atom_server_host = getenv("ATOM_SERVER_HOST");
  }
  if (atom_server_host == (char *)0x0) {
    atom_server_host = "atomhost.cercs.gatech.edu";
  }
  as_00->server_id = atom_server_host;
  as_00->tcp_fd = -1;
  pcVar3 = getenv("ATL_USE_TCP");
  as_00->use_tcp = (uint)(pcVar3 != (char *)0x0);
  as_00->no_server = 1;
  Tcl_InitHashTable(&as_00->string_hash_table,0);
  Tcl_InitHashTable(&as_00->value_hash_table,1);
  phVar4 = gethostbyname(atom_server_host);
  as_00->he = (hostent *)phVar4;
  if (phVar4 == (hostent *)0x0) {
    as_00->he = (hostent *)0x0;
    (as_00->their_addr).sin_addr.s_addr = 0;
  }
  else {
    (as_00->their_addr).sin_addr.s_addr = *(in_addr_t *)*as_00->he->h_addr_list;
  }
  iVar2 = socket(2,2,0);
  as_00->sockfd = iVar2;
  if (iVar2 == -1) {
    perror("socket");
    exit(1);
  }
  iVar2 = fcntl(as_00->sockfd,3);
  as_00->flags = iVar2;
  (as_00->their_addr).sin_family = 2;
  uVar1 = htons(0x115c);
  (as_00->their_addr).sin_port = uVar1;
  memset((as_00->their_addr).sin_zero,0,8);
  preload_in_use_atoms(as_00);
  as_00->no_server = 0;
  return as_00;
}

Assistant:

atom_server
init_atom_server(atom_cache_type cache_style)
{
    atom_server as = (atom_server) malloc(sizeof(atom_server_struct));

    nt_socket_init_func();
    if (atom_server_host == NULL) {	/* environment override */
	atom_server_host = getenv("ATOM_SERVER_HOST");
    }
    if (atom_server_host == NULL) {
	atom_server_host = ATOM_SERVER_HOST;	/* from configure */
    }
    as->server_id = atom_server_host;
    as->tcp_fd = -1;
    as->use_tcp = (getenv("ATL_USE_TCP") != NULL);
    as->no_server = 1;

    Tcl_InitHashTable(&as->string_hash_table, TCL_STRING_KEYS);
    Tcl_InitHashTable(&as->value_hash_table, TCL_ONE_WORD_KEYS);

    if ((as->he = gethostbyname(atom_server_host)) == NULL) {
	as->he = NULL;
	as->their_addr.sin_addr.s_addr = 0;
    } else {
	as->their_addr.sin_addr = *((struct in_addr *) as->he->h_addr);
    }
    if ((as->sockfd = (int) socket(AF_INET, SOCK_DGRAM, 0)) == -1) {
	perror("socket");
	exit(1);
    }
#ifndef HAVE_WINDOWS_H
    as->flags = fcntl(as->sockfd, F_GETFL);
#else
    as->flags = 0;
#endif
    as->their_addr.sin_family = AF_INET;
    as->their_addr.sin_port = htons(UDP_PORT);
    memset(&(as->their_addr.sin_zero), '\0', 8);

    preload_in_use_atoms(as);
    as->no_server = 0;
    return as;
}